

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::IsSpentKey(CWallet *this,CScript *scriptPubKey)

{
  bool bVar1;
  LegacyScriptPubKeyMan *pLVar2;
  bool bVar3;
  pointer pubkey_id;
  long in_FS_OFFSET;
  PKHash pkh_dest;
  ScriptHash sh_wpkh_dest;
  WitnessV0KeyHash wpkh_dest;
  CTxDestination dest;
  _Vector_base<CKeyID,_std::allocator<CKeyID>_> local_148;
  direct_or_indirect local_130;
  ScriptHash local_10c;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_f8;
  undefined1 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_40 = 0;
  bVar1 = ExtractDestination(scriptPubKey,(CTxDestination *)&local_88._M_first);
  if (bVar1) {
    bVar1 = IsAddressPreviouslySpent(this,(CTxDestination *)&local_88._M_first);
    bVar3 = true;
    if (bVar1) goto LAB_0014901e;
    pLVar2 = GetLegacyScriptPubKeyMan(this);
    if (pLVar2 != (LegacyScriptPubKeyMan *)0x0) {
      GetAffectedKeys((vector<CKeyID,_std::allocator<CKeyID>_> *)&local_148,scriptPubKey,
                      &(pLVar2->super_LegacyDataSPKM).super_FillableSigningProvider.
                       super_SigningProvider);
      pubkey_id = local_148._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pubkey_id == local_148._M_impl.super__Vector_impl_data._M_finish) {
          std::_Vector_base<CKeyID,_std::allocator<CKeyID>_>::~_Vector_base(&local_148);
          goto LAB_0014901c;
        }
        local_f8._16_4_ =
             *(undefined4 *)
              ((pubkey_id->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10);
        local_f8._0_8_ =
             *(undefined8 *)(pubkey_id->super_uint160).super_base_blob<160U>.m_data._M_elems;
        local_f8._8_8_ =
             *(undefined8 *)((pubkey_id->super_uint160).super_base_blob<160U>.m_data._M_elems + 8);
        local_b0 = 5;
        local_a8 = local_f8._0_8_;
        uStack_a0 = local_f8._8_8_;
        local_98 = local_f8._16_4_;
        bVar1 = IsAddressPreviouslySpent(this,(CTxDestination *)&local_f8._M_first);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
        if (bVar1) break;
        local_f8._16_4_ = local_98;
        local_f8._0_8_ = local_a8;
        local_f8._8_8_ = uStack_a0;
        local_b0 = 5;
        GetScriptForDestination
                  ((CScript *)&local_130.indirect_contents,(CTxDestination *)&local_f8._M_first);
        ScriptHash::ScriptHash(&local_10c,(CScript *)&local_130.indirect_contents);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_130.indirect_contents)
        ;
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
        local_f8._M_first._M_storage._M_storage[0x10] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
        local_f8._M_first._M_storage._M_storage[0x11] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
        local_f8._M_first._M_storage._M_storage[0x12] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
        local_f8._M_first._M_storage._M_storage[0x13] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
        local_f8._M_first._M_storage._M_storage[0] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0];
        local_f8._M_first._M_storage._M_storage[1] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
        local_f8._M_first._M_storage._M_storage[2] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
        local_f8._M_first._M_storage._M_storage[3] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
        local_f8._M_first._M_storage._M_storage[4] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
        local_f8._M_first._M_storage._M_storage[5] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
        local_f8._M_first._M_storage._M_storage[6] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
        local_f8._M_first._M_storage._M_storage[7] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
        local_f8._M_first._M_storage._M_storage[8] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
        local_f8._M_first._M_storage._M_storage[9] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
        local_f8._M_first._M_storage._M_storage[10] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10];
        local_f8._M_first._M_storage._M_storage[0xb] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
        local_f8._M_first._M_storage._M_storage[0xc] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
        local_f8._M_first._M_storage._M_storage[0xd] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
        local_f8._M_first._M_storage._M_storage[0xe] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
        local_f8._M_first._M_storage._M_storage[0xf] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
        local_b0 = 3;
        bVar1 = IsAddressPreviouslySpent(this,(CTxDestination *)&local_f8._M_first);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
        if (bVar1) break;
        PKHash::PKHash((PKHash *)&local_130.indirect_contents,pubkey_id);
        local_f8._16_4_ = local_130._16_4_;
        local_f8._0_8_ = local_130.indirect_contents.indirect;
        local_f8._8_8_ = local_130._8_8_;
        local_b0 = 2;
        bVar1 = IsAddressPreviouslySpent(this,(CTxDestination *)&local_f8._M_first);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
        pubkey_id = pubkey_id + 1;
      } while (!bVar1);
      std::_Vector_base<CKeyID,_std::allocator<CKeyID>_>::~_Vector_base(&local_148);
      goto LAB_0014901e;
    }
  }
LAB_0014901c:
  bVar3 = false;
LAB_0014901e:
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_88._M_first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::IsSpentKey(const CScript& scriptPubKey) const
{
    AssertLockHeld(cs_wallet);
    CTxDestination dest;
    if (!ExtractDestination(scriptPubKey, dest)) {
        return false;
    }
    if (IsAddressPreviouslySpent(dest)) {
        return true;
    }

    if (LegacyScriptPubKeyMan* spk_man = GetLegacyScriptPubKeyMan()) {
        for (const auto& keyid : GetAffectedKeys(scriptPubKey, *spk_man)) {
            WitnessV0KeyHash wpkh_dest(keyid);
            if (IsAddressPreviouslySpent(wpkh_dest)) {
                return true;
            }
            ScriptHash sh_wpkh_dest(GetScriptForDestination(wpkh_dest));
            if (IsAddressPreviouslySpent(sh_wpkh_dest)) {
                return true;
            }
            PKHash pkh_dest(keyid);
            if (IsAddressPreviouslySpent(pkh_dest)) {
                return true;
            }
        }
    }
    return false;
}